

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::init
          (AtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  RenderContext *pRVar1;
  Program *this_00;
  Shader *this_01;
  DefaultBlock *pDVar2;
  Layout local_240;
  allocator<char> local_229;
  string local_228;
  VarType local_208;
  undefined1 local_1f0 [8];
  VariableDeclaration decl_2;
  allocator<char> local_179;
  string local_178;
  VarType local_158;
  undefined1 local_140 [8];
  VariableDeclaration decl_1;
  allocator<char> local_c9;
  string local_c8;
  VarType local_a8;
  undefined1 local_90 [8];
  VariableDeclaration decl;
  GLSLVersion glslVersion;
  Shader *shader;
  AtomicCounterCase *this_local;
  
  pRVar1 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  this_01 = ProgramInterfaceDefinition::Program::addShader
                      (this->m_program,SHADERTYPE_COMPUTE,version);
  glu::VarType::VarType(&local_a8,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"binding1_counter1",&local_c9);
  glu::Layout::Layout((Layout *)((long)&decl_1.name.field_2 + 8),-1,-1,-1,FORMATLAYOUT_LAST,
                      MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            ((VariableDeclaration *)local_90,&local_a8,&local_c8,STORAGE_UNIFORM,INTERPOLATION_LAST,
             (Layout *)((long)&decl_1.name.field_2 + 8),0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::VarType::~VarType(&local_a8);
  local_90._4_4_ = 1;
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&pDVar2->variables,(value_type *)local_90);
  glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_90);
  glu::VarType::VarType(&local_158,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"binding1_counter2",&local_179);
  glu::Layout::Layout((Layout *)((long)&decl_2.name.field_2 + 8),-1,-1,-1,FORMATLAYOUT_LAST,
                      MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            ((VariableDeclaration *)local_140,&local_158,&local_178,STORAGE_UNIFORM,
             INTERPOLATION_LAST,(Layout *)((long)&decl_2.name.field_2 + 8),0);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  glu::VarType::~VarType(&local_158);
  local_140._4_4_ = 1;
  decl_1.layout.location = 8;
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&pDVar2->variables,(value_type *)local_140);
  glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_140);
  glu::VarType::VarType(&local_208,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"binding2_counter1",&local_229);
  glu::Layout::Layout(&local_240,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            ((VariableDeclaration *)local_1f0,&local_208,&local_228,STORAGE_UNIFORM,
             INTERPOLATION_LAST,&local_240,0);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  glu::VarType::~VarType(&local_208);
  local_1f0._4_4_ = 2;
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&pDVar2->variables,(value_type *)local_1f0);
  glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_1f0);
  return extraout_EAX;
}

Assistant:

void AtomicCounterCase::init (void)
{
	ProgramInterfaceDefinition::Shader* shader;
	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter2", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		decl.layout.offset = 8;

		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding2_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 2;
		shader->getDefaultBlock().variables.push_back(decl);
	}

	DE_ASSERT(m_program->isValid());
}